

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_protocol.cc
# Opt level: O1

void __thiscall helix::nasdaq::itch50_protocol::itch50_protocol(itch50_protocol *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_protocol)._vptr_protocol = (_func_int **)&PTR__itch50_protocol_00120a60;
  paVar1 = &(this->_name).field_2;
  (this->_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_name).field_2 + 8) = uVar4;
  }
  else {
    (this->_name)._M_dataplus._M_p = pcVar3;
    (this->_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

itch50_protocol::itch50_protocol(std::string name)
    :_name{std::move(name)}
{
}